

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O1

string * __thiscall
tinyformat::format<char[11],std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,char (*args) [11],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  long in_FS_OFFSET;
  ostringstream oss;
  undefined1 auStack_208 [376];
  FormatArg *local_90;
  undefined4 local_88;
  FormatArg local_80;
  char (*local_68) [11];
  code *local_60;
  code *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  code *local_48;
  code *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_208);
  local_90 = &local_80;
  local_88 = 3;
  local_80.m_formatImpl = detail::FormatArg::formatImpl<char[11]>;
  local_80.m_toIntImpl = detail::FormatArg::toIntImpl<char[11]>;
  local_60 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_58 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_48 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_40 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_80.m_value = fmt;
  local_68 = args;
  local_50 = args_1;
  detail::formatImpl((ostream *)auStack_208,(char *)this,local_90,3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_208);
  std::ios_base::~ios_base((ios_base *)(auStack_208 + 0x70));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}